

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O0

void __thiscall HPreData::printSolution(HPreData *this)

{
  _Setw _Var1;
  ostream *poVar2;
  reference pvVar3;
  long in_RDI;
  int i;
  char buff [10];
  int local_18;
  char local_12 [18];
  
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar2,"Col value: ");
  for (local_18 = 0; local_18 < *(int *)(in_RDI + 0xc); local_18 = local_18 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1b0),(long)local_18);
    sprintf(local_12,"%2.2f ",*pvVar3);
    _Var1 = std::setw(5);
    poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
    std::operator<<(poVar2,local_12);
    if (local_18 % 0x1e == 0) {
      std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    }
  }
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void HPreData::printSolution() {
	char buff [10];
    cout<<endl<<"Col value: ";
    for (int i=0;i<numColOriginal;i++) {
    	sprintf(buff, "%2.2f ", valuePrimal[i]);
    	cout<<setw(5)<<buff;
    	if ((i%30) == 0)
    		cout<<std::flush;
    	}

    cout<<endl<<endl;
}